

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

UniValue * __thiscall
DescribeAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeAddressVisitor *this,WitnessUnknown *id)

{
  pointer puVar1;
  string key;
  string key_00;
  string key_01;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  undefined8 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  uint uVar2;
  undefined4 in_stack_fffffffffffffe34;
  size_type in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe48 [16];
  _Alloc_hider in_stack_fffffffffffffe58;
  size_type in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe70 [48];
  long *local_158 [2];
  long local_148 [2];
  UniValue local_138;
  long *local_e0 [2];
  long local_d0 [2];
  UniValue local_c0;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_37;
  undefined4 local_2f;
  undefined2 local_2b;
  char local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &local_38;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_37;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_2f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_2b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_29;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_40 = 0;
  local_38 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"iswitness","");
  uVar2 = CONCAT31((int3)(in_stack_fffffffffffffe30 >> 8),1);
  ::UniValue::UniValue<bool,_bool,_true>(&local_c0,(bool *)&stack0xfffffffffffffe30);
  key._M_string_length._0_4_ = uVar2;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  key._M_string_length._4_4_ = in_stack_fffffffffffffe34;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
  key.field_2._8_8_ = in_stack_fffffffffffffe40;
  val.val._M_string_length = (size_type)in_stack_fffffffffffffe58._M_p;
  val.typ = in_stack_fffffffffffffe48._0_4_;
  val._4_4_ = in_stack_fffffffffffffe48._4_4_;
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48._8_8_;
  val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe60;
  val.val.field_2._8_8_ = in_stack_fffffffffffffe68;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe70._0_24_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
       = (_Vector_base<UniValue,_std::allocator<UniValue>_>)
         (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe70._24_24_;
  ::UniValue::pushKV(__return_storage_ptr__,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val._M_dataplus._M_p != &local_c0.val.field_2) {
    operator_delete(local_c0.val._M_dataplus._M_p,local_c0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"witness_version","");
  uVar2 = id->m_version;
  ::UniValue::UniValue<unsigned_int,_unsigned_int,_true>
            (&local_138,(uint *)&stack0xfffffffffffffe30);
  key_00._M_string_length._0_4_ = uVar2;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  key_00._M_string_length._4_4_ = in_stack_fffffffffffffe34;
  key_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
  key_00.field_2._8_8_ = in_stack_fffffffffffffe40;
  val_00.val._M_string_length = (size_type)in_stack_fffffffffffffe58._M_p;
  val_00.typ = in_stack_fffffffffffffe48._0_4_;
  val_00._4_4_ = in_stack_fffffffffffffe48._4_4_;
  val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48._8_8_;
  val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe60;
  val_00.val.field_2._8_8_ = in_stack_fffffffffffffe68;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe70._0_24_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe70._24_24_;
  ::UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_138.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.val._M_dataplus._M_p != &local_138.val.field_2) {
    operator_delete(local_138.val._M_dataplus._M_p,local_138.val.field_2._M_allocated_capacity + 1);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"witness_program","");
  puVar1 = (id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  s.m_size = (long)(id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  s.m_data = puVar1;
  HexStr_abi_cxx11_((string *)&stack0xfffffffffffffe30,s);
  ::UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((UniValue *)&stack0xfffffffffffffe50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe30);
  key_01._M_string_length._0_4_ = uVar2;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  key_01._M_string_length._4_4_ = in_stack_fffffffffffffe34;
  key_01.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
  key_01.field_2._8_8_ = in_stack_fffffffffffffe40;
  val_01.val._M_string_length = (size_type)in_stack_fffffffffffffe58._M_p;
  val_01.typ = in_stack_fffffffffffffe48._0_4_;
  val_01._4_4_ = in_stack_fffffffffffffe48._4_4_;
  val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48._8_8_;
  val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffe60;
  val_01.val.field_2._8_8_ = in_stack_fffffffffffffe68;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffe70._0_24_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffe70._24_24_;
  ::UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe78);
  if (in_stack_fffffffffffffe58._M_p != &stack0xfffffffffffffe68) {
    operator_delete(in_stack_fffffffffffffe58._M_p,in_stack_fffffffffffffe68 + 1);
  }
  if ((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,uVar2) != &stack0xfffffffffffffe40) {
    operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,uVar2),
                    in_stack_fffffffffffffe40 + 1);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessUnknown& id) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("iswitness", true);
        obj.pushKV("witness_version", id.GetWitnessVersion());
        obj.pushKV("witness_program", HexStr(id.GetWitnessProgram()));
        return obj;
    }